

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O1

string * __thiscall
LongReadsDatastore::get_read_sequence_abi_cxx11_
          (string *__return_storage_ptr__,LongReadsDatastore *this,size_t readID)

{
  int iVar1;
  pointer pRVar2;
  __off_t __offset;
  long lVar3;
  size_t sVar4;
  ulong __nbytes;
  char *__s;
  undefined8 uStack_30;
  
  pRVar2 = (this->read_to_fileRecord).super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __nbytes = (ulong)(pRVar2[readID].record_size + 1);
  lVar3 = -(__nbytes + 0xf & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffd8 + lVar3;
  __offset = pRVar2[readID].offset;
  iVar1 = this->fd;
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x1958e6;
  lseek(iVar1,__offset,0);
  iVar1 = this->fd;
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x1958f5;
  ::read(iVar1,__s,__nbytes);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x195904;
  sVar4 = strlen(__s);
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x195913;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string LongReadsDatastore::get_read_sequence(size_t readID) const {
    char buffer[read_to_fileRecord[readID].record_size+1];
    size_t read_offset_in_file=read_to_fileRecord[readID].offset;
    lseek(fd,read_offset_in_file,SEEK_SET);
    ::read(fd,buffer,sizeof(buffer));
    return std::string(buffer);
}